

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsScene::clear(QGraphicsScene *this)

{
  long lVar1;
  iterator iVar2;
  
  lVar1 = *(long *)(this + 8);
  (**(code **)(**(long **)(lVar1 + 0x88) + 0xa8))();
  while (*(long *)(lVar1 + 0x158) != 0) {
    iVar2 = QList<QGraphicsItem_*>::begin((QList<QGraphicsItem_*> *)(lVar1 + 0x148));
    if (*iVar2.i != (QGraphicsItem *)0x0) {
      (*(*iVar2.i)->_vptr_QGraphicsItem[1])();
    }
  }
  *(undefined4 *)(lVar1 + 0x90) = 0;
  *(uint *)(lVar1 + 0xb8) = *(uint *)(lVar1 + 0xb8) | 0x33000;
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }